

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

ObjectComprehensionSimple * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::ObjectComprehensionSimple,jsonnet::internal::LocationRange&,jsonnet::internal::Index*,jsonnet::internal::Local*,jsonnet::internal::Identifier_const*&,jsonnet::internal::AST*&>
          (Allocator *this,LocationRange *args,Index **args_1,Local **args_2,Identifier **args_3,
          AST **args_4)

{
  size_t *psVar1;
  ObjectComprehensionSimple *this_00;
  _List_node_base *p_Var2;
  
  this_00 = (ObjectComprehensionSimple *)operator_new(0xa0);
  ObjectComprehensionSimple::ObjectComprehensionSimple
            (this_00,args,&(*args_1)->super_AST,&(*args_2)->super_AST,*args_3,*args_4);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->allocated).
            super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }